

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

ParameterizedTestCaseInfo<DriverTest> *
testing::internal::
CheckedDowncastToActualType<testing::internal::ParameterizedTestCaseInfo<DriverTest>,testing::internal::ParameterizedTestCaseInfoBase>
          (ParameterizedTestCaseInfoBase *base)

{
  bool bVar1;
  ParameterizedTestCaseInfo<DriverTest> *pPVar2;
  undefined8 uVar3;
  GTestLog local_c;
  
  if (base != (ParameterizedTestCaseInfoBase *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)base->_vptr_ParameterizedTestCaseInfoBase[-1],
                       (type_info *)&ParameterizedTestCaseInfo<DriverTest>::typeinfo);
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/third/gtest-1.7.0/include/gtest/internal/gtest-port.h"
                         ,0x47b);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_c);
    }
    pPVar2 = (ParameterizedTestCaseInfo<DriverTest> *)
             __dynamic_cast(base,&ParameterizedTestCaseInfoBase::typeinfo,
                            &ParameterizedTestCaseInfo<DriverTest>::typeinfo,0);
    return pPVar2;
  }
  uVar3 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar3);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}